

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O3

void __thiscall IR::Opnd::DumpOpndKindMemRef(Opnd *this,bool AsmDumpMode,Func *func)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  char16 local_128 [4];
  char16 buffer [128];
  
  if (this->m_kind != OpndKindMemRef) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1ec,"(this->IsMemRefOpnd())","Bad call to AsMemRefOpnd()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  Output::Print(L"[");
  GetAddrDescription(local_128,0x80,this[1]._vptr_Opnd,*(AddrOpndKind *)&this[1].m_valueType.field_0
                     ,false,true,func,false);
  Output::Print(L"%s",local_128);
  Output::Print(L"]");
  return;
}

Assistant:

void
Opnd::DumpOpndKindMemRef(bool AsmDumpMode, Func *func)
{
    MemRefOpnd *memRefOpnd = this->AsMemRefOpnd();
    Output::Print(_u("["));
    const size_t BUFFER_LEN = 128;
    char16 buffer[BUFFER_LEN];
    // TODO: michhol, make this intptr_t
    GetAddrDescription(buffer, BUFFER_LEN, (void*)memRefOpnd->GetMemLoc(), memRefOpnd->GetAddrKind(), AsmDumpMode, true, func);
    Output::Print(_u("%s"), buffer);
    Output::Print(_u("]"));
}